

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O3

void __thiscall
Js::JavascriptPromiseCapability::JavascriptPromiseCapability
          (JavascriptPromiseCapability *this,Var promise,Var resolve,Var reject)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0152f088;
  Memory::Recycler::WBSetBit((char *)&this->promise);
  (this->promise).ptr = promise;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->promise);
  Memory::Recycler::WBSetBit((char *)&this->resolve);
  (this->resolve).ptr = resolve;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->resolve);
  Memory::Recycler::WBSetBit((char *)&this->reject);
  (this->reject).ptr = reject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->reject);
  return;
}

Assistant:

JavascriptPromiseCapability(Var promise, Var resolve, Var reject)
            : promise(promise), resolve(resolve), reject(reject)
        { }